

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

int Nwk_ObjLevelNew(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  int iVar1;
  int iVar2;
  int b;
  Nwk_Obj_t *pObj_00;
  bool bVar3;
  bool local_49;
  int local_3c;
  int Level;
  int nTerms;
  int iTerm1;
  int iBox;
  int i;
  Nwk_Obj_t *pFanin;
  Tim_Man_t *pManTime;
  Nwk_Obj_t *pObj_local;
  
  p = pObj->pMan->pManTime;
  local_3c = 0;
  iVar1 = Nwk_ObjIsCi(pObj);
  if ((iVar1 == 0) && (iVar1 = Nwk_ObjIsLatch(pObj), iVar1 == 0)) {
    iVar1 = Nwk_ObjIsNode(pObj);
    if ((iVar1 == 0) && (iVar1 = Nwk_ObjIsCo(pObj), iVar1 == 0)) {
      __assert_fail("Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                    ,0x2ed,"int Nwk_ObjLevelNew(Nwk_Obj_t *)");
    }
    iTerm1 = 0;
    while( true ) {
      bVar3 = false;
      if (iTerm1 < pObj->nFanins) {
        _iBox = pObj->pFanio[iTerm1];
        bVar3 = _iBox != (Nwk_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Nwk_ObjLevel(_iBox);
      local_3c = Abc_MaxInt(local_3c,iVar1);
      iTerm1 = iTerm1 + 1;
    }
    iVar1 = Nwk_ObjIsNode(pObj);
    local_49 = false;
    if (iVar1 != 0) {
      iVar1 = Nwk_ObjFaninNum(pObj);
      local_49 = 0 < iVar1;
    }
    pObj_local._4_4_ = local_3c + (uint)local_49;
  }
  else {
    if ((p != (Tim_Man_t *)0x0) &&
       (iVar1 = Tim_ManBoxForCi(p,*(uint *)&pObj->field_0x20 >> 7), -1 < iVar1)) {
      iVar2 = Tim_ManBoxInputFirst(p,iVar1);
      iVar1 = Tim_ManBoxInputNum(p,iVar1);
      for (iTerm1 = 0; iTerm1 < iVar1; iTerm1 = iTerm1 + 1) {
        pObj_00 = Nwk_ManCo(pObj->pMan,iVar2 + iTerm1);
        b = Nwk_ObjLevel(pObj_00);
        local_3c = Abc_MaxInt(local_3c,b);
      }
      local_3c = local_3c + 1;
    }
    pObj_local._4_4_ = local_3c;
  }
  return pObj_local._4_4_;
}

Assistant:

int Nwk_ObjLevelNew( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Nwk_Obj_t * pFanin;
    int i, iBox, iTerm1, nTerms, Level = 0;
    if ( Nwk_ObjIsCi(pObj) || Nwk_ObjIsLatch(pObj) )
    {
        if ( pManTime )
        {
            iBox = Tim_ManBoxForCi( pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this CI is an output of the box
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pFanin = Nwk_ManCo(pObj->pMan, iTerm1 + i);
                    Level = Abc_MaxInt( Level, Nwk_ObjLevel(pFanin) );
                }
                Level++;
            }
        }
        return Level;
    }
    assert( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) );
    Nwk_ObjForEachFanin( pObj, pFanin, i )
        Level = Abc_MaxInt( Level, Nwk_ObjLevel(pFanin) );
    return Level + (Nwk_ObjIsNode(pObj) && Nwk_ObjFaninNum(pObj) > 0);
}